

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::type_caster<unsigned_int,_void>::load
          (type_caster<unsigned_int,_void> *this,handle src,bool convert)

{
  bool bVar1;
  int iVar2;
  PyObject **ppPVar3;
  unsigned_long uVar4;
  long lVar5;
  PyObject *ptr;
  bool local_79;
  handle local_58;
  handle local_50;
  object tmp;
  handle hStack_40;
  bool py_err;
  handle src_or_index;
  anon_class_1_0_00000001 index_check;
  py_type py_value;
  bool convert_local;
  type_caster<unsigned_int,_void> *this_local;
  handle src_local;
  
  this_local = (type_caster<unsigned_int,_void> *)src.m_ptr;
  bVar1 = pybind11::handle::operator_cast_to_bool((handle *)&this_local);
  if (!bVar1) {
    src_local.m_ptr._7_1_ = 0;
    goto LAB_006a5890;
  }
  ppPVar3 = pybind11::handle::ptr((handle *)&this_local);
  iVar2 = ::_PyObject_TypeCheck(*ppPVar3,(PyTypeObject *)&PyFloat_Type);
  if (iVar2 == 0) {
    if (!convert) {
      ppPVar3 = pybind11::handle::ptr((handle *)&this_local);
      iVar2 = ::PyType_HasFeature((*ppPVar3)->ob_type,0x1000000);
      if (iVar2 == 0) {
        ppPVar3 = pybind11::handle::ptr((handle *)&this_local);
        iVar2 = load::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)((long)&src_or_index.m_ptr + 7),*ppPVar3);
        if (iVar2 == 0) goto LAB_006a5774;
      }
    }
    hStack_40.m_ptr = (PyObject *)this_local;
    ppPVar3 = pybind11::handle::ptr(&stack0xffffffffffffffc0);
    uVar4 = as_unsigned<unsigned_long>(*ppPVar3);
    local_79 = false;
    if (uVar4 == 0xffffffffffffffff) {
      lVar5 = PyErr_Occurred();
      local_79 = lVar5 != 0;
    }
    tmp.super_handle.m_ptr._7_1_ = local_79;
    if ((local_79 == false) && (uVar4 == (uVar4 & 0xffffffff))) {
      this->value = (uint)uVar4;
      src_local.m_ptr._7_1_ = 1;
    }
    else {
      PyErr_Clear();
      if (((tmp.super_handle.m_ptr._7_1_ & 1) != 0) && (convert)) {
        ppPVar3 = pybind11::handle::ptr((handle *)&this_local);
        iVar2 = PyNumber_Check(*ppPVar3);
        if (iVar2 != 0) {
          ppPVar3 = pybind11::handle::ptr((handle *)&this_local);
          ptr = (PyObject *)PyNumber_Long(*ppPVar3);
          pybind11::handle::handle(&local_58,ptr);
          reinterpret_steal<pybind11::object>((pybind11 *)&local_50,local_58);
          PyErr_Clear();
          src_local.m_ptr._7_1_ = load(this,local_50,false);
          object::~object((object *)&local_50);
          goto LAB_006a5890;
        }
      }
      src_local.m_ptr._7_1_ = 0;
    }
  }
  else {
LAB_006a5774:
    src_local.m_ptr._7_1_ = 0;
  }
LAB_006a5890:
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool convert) {
        py_type py_value;

        if (!src)
            return false;

#if !defined(PYPY_VERSION)
        auto index_check = [](PyObject *o) { return PyIndex_Check(o); };
#else
        // In PyPy 7.3.3, `PyIndex_Check` is implemented by calling `__index__`,
        // while CPython only considers the existence of `nb_index`/`__index__`.
        auto index_check = [](PyObject *o) { return hasattr(o, "__index__"); };
#endif

        if (std::is_floating_point<T>::value) {
            if (convert || PyFloat_Check(src.ptr()))
                py_value = (py_type) PyFloat_AsDouble(src.ptr());
            else
                return false;
        } else if (PyFloat_Check(src.ptr())
                   || (!convert && !PYBIND11_LONG_CHECK(src.ptr()) && !index_check(src.ptr()))) {
            return false;
        } else {
            handle src_or_index = src;
#if PY_VERSION_HEX < 0x03080000
            object index;
            if (!PYBIND11_LONG_CHECK(src.ptr())) {  // So: index_check(src.ptr())
                index = reinterpret_steal<object>(PyNumber_Index(src.ptr()));
                if (!index) {
                    PyErr_Clear();
                    if (!convert)
                        return false;
                }
                else {
                    src_or_index = index;
                }
            }
#endif
            if (std::is_unsigned<py_type>::value) {
                py_value = as_unsigned<py_type>(src_or_index.ptr());
            } else { // signed integer:
                py_value = sizeof(T) <= sizeof(long)
                    ? (py_type) PyLong_AsLong(src_or_index.ptr())
                    : (py_type) PYBIND11_LONG_AS_LONGLONG(src_or_index.ptr());
            }
        }

        // Python API reported an error
        bool py_err = py_value == (py_type) -1 && PyErr_Occurred();

        // Check to see if the conversion is valid (integers should match exactly)
        // Signed/unsigned checks happen elsewhere
        if (py_err || (std::is_integral<T>::value && sizeof(py_type) != sizeof(T) && py_value != (py_type) (T) py_value)) {
            PyErr_Clear();
            if (py_err && convert && (PyNumber_Check(src.ptr()) != 0)) {
                auto tmp = reinterpret_steal<object>(std::is_floating_point<T>::value
                                                     ? PyNumber_Float(src.ptr())
                                                     : PyNumber_Long(src.ptr()));
                PyErr_Clear();
                return load(tmp, false);
            }
            return false;
        }

        value = (T) py_value;
        return true;
    }